

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

event * event_base_get_running_event(event_base *base)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  event_callback *evcb;
  event *ev;
  event_base *base_local;
  
  evcb = (event_callback *)0x0;
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (((evthread_id_fn_ == (_func_unsigned_long *)0x0) ||
      (uVar1 = base->th_owner_id, uVar2 = (*evthread_id_fn_)(), uVar1 == uVar2)) &&
     ((base->current_event->evcb_flags & 0x80U) != 0)) {
    evcb = &event_callback_to_event(base->current_event)->ev_evcallback;
  }
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  return (event *)evcb;
}

Assistant:

struct event *
event_base_get_running_event(struct event_base *base)
{
	struct event *ev = NULL;
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	if (EVBASE_IN_THREAD(base)) {
		struct event_callback *evcb = base->current_event;
		if (evcb->evcb_flags & EVLIST_INIT)
			ev = event_callback_to_event(evcb);
	}
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return ev;
}